

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

int __thiscall btConvexHullInternal::Face::init(Face *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long in_RCX;
  long in_RDX;
  EVP_PKEY_CTX *pEVar4;
  Point32 PVar5;
  
  this->nearbyVertex = (Vertex *)ctx;
  uVar2 = *(undefined8 *)(ctx + 0x68);
  uVar3 = *(undefined8 *)(ctx + 0x70);
  (this->origin).x = (int)uVar2;
  (this->origin).y = (int)((ulong)uVar2 >> 0x20);
  (this->origin).z = (int)uVar3;
  (this->origin).index = (int)((ulong)uVar3 >> 0x20);
  PVar5 = Point32::operator-((Point32 *)(in_RDX + 0x68),(Point32 *)(ctx + 0x68));
  this->dir0 = PVar5;
  PVar5 = Point32::operator-((Point32 *)(in_RCX + 0x68),(Point32 *)(ctx + 0x68));
  this->dir1 = PVar5;
  lVar1 = *(long *)(ctx + 0x20);
  pEVar4 = (EVP_PKEY_CTX *)(lVar1 + 0x10);
  if (lVar1 == 0) {
    pEVar4 = ctx + 0x18;
  }
  *(Face **)pEVar4 = this;
  *(Face **)(ctx + 0x20) = this;
  return (int)lVar1;
}

Assistant:

void init(Vertex* a, Vertex* b, Vertex* c)
				{
					nearbyVertex = a;
					origin = a->point;
					dir0 = *b - *a;
					dir1 = *c - *a;
					if (a->lastNearbyFace)
					{
						a->lastNearbyFace->nextWithSameNearbyVertex = this;
					}
					else
					{
						a->firstNearbyFace = this;
					}
					a->lastNearbyFace = this;
				}